

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticlePairs.test.cpp
# Opt level: O2

void verifyChunk(ParticlePairs *chunk)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  range_reference_t<D<true>_>_conflict rVar3;
  long lVar4;
  range_reference_t<D<true>_> pdVar5;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef macroName_27;
  StringRef macroName_28;
  StringRef macroName_29;
  StringRef macroName_30;
  StringRef macroName_31;
  StringRef macroName_32;
  StringRef macroName_33;
  StringRef macroName_34;
  StringRef macroName_35;
  StringRef macroName_36;
  StringRef macroName_37;
  StringRef macroName_38;
  StringRef macroName_39;
  StringRef macroName_40;
  StringRef macroName_41;
  StringRef macroName_42;
  StringRef macroName_43;
  StringRef macroName_44;
  StringRef macroName_45;
  StringRef macroName_46;
  StringRef macroName_47;
  StringRef macroName_48;
  StringRef macroName_49;
  StringRef macroName_50;
  StringRef macroName_51;
  StringRef macroName_52;
  StringRef macroName_53;
  StringRef macroName_54;
  StringRef macroName_55;
  StringRef macroName_56;
  StringRef macroName_57;
  StringRef macroName_58;
  StringRef macroName_59;
  StringRef macroName_60;
  StringRef macroName_61;
  StringRef macroName_62;
  StringRef macroName_63;
  StringRef macroName_64;
  StringRef macroName_65;
  StringRef macroName_66;
  StringRef macroName_67;
  StringRef macroName_68;
  StringRef macroName_69;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  StringRef capturedExpression_27;
  StringRef capturedExpression_28;
  StringRef capturedExpression_29;
  StringRef capturedExpression_30;
  StringRef capturedExpression_31;
  StringRef capturedExpression_32;
  StringRef capturedExpression_33;
  StringRef capturedExpression_34;
  StringRef capturedExpression_35;
  StringRef capturedExpression_36;
  StringRef capturedExpression_37;
  StringRef capturedExpression_38;
  StringRef capturedExpression_39;
  StringRef capturedExpression_40;
  StringRef capturedExpression_41;
  StringRef capturedExpression_42;
  StringRef capturedExpression_43;
  StringRef capturedExpression_44;
  StringRef capturedExpression_45;
  StringRef capturedExpression_46;
  StringRef capturedExpression_47;
  StringRef capturedExpression_48;
  StringRef capturedExpression_49;
  StringRef capturedExpression_50;
  StringRef capturedExpression_51;
  StringRef capturedExpression_52;
  StringRef capturedExpression_53;
  StringRef capturedExpression_54;
  StringRef capturedExpression_55;
  StringRef capturedExpression_56;
  StringRef capturedExpression_57;
  StringRef capturedExpression_58;
  StringRef capturedExpression_59;
  StringRef capturedExpression_60;
  StringRef capturedExpression_61;
  StringRef capturedExpression_62;
  StringRef capturedExpression_63;
  StringRef capturedExpression_64;
  StringRef capturedExpression_65;
  StringRef capturedExpression_66;
  StringRef capturedExpression_67;
  StringRef capturedExpression_68;
  StringRef capturedExpression_69;
  double local_100;
  AssertionHandler catchAssertionHandler;
  undefined1 local_b0 [8];
  undefined8 local_a8;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98 [2];
  undefined1 local_78 [8];
  bool local_70;
  bool bStack_6f;
  undefined2 uStack_6e;
  undefined4 uStack_6c;
  _Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
  local_68;
  ulong local_60;
  ulong local_58;
  MatchExpr<int,_Catch::Matchers::WithinRelMatcher> local_50;
  
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xcb;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x11;
  capturedExpression.m_start = "1 == chunk.NJSX()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)local_b0,capturedExpression,
             ContinueOnFailure);
  local_98[0]._8_4_ =
       (undefined4)
       ((_Head_base<3UL,_long,_false> *)
       ((long)&(chunk->super_ListRecord).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long> + 0x10))->_M_head_impl;
  local_a8._1_1_ = local_98[0]._8_4_ == 1;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc2b0;
  local_a8._4_4_ = 1;
  local_a0._M_current = (double *)0x181da4;
  local_98[0]._M_allocated_capacity = (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xcc;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x1d;
  capturedExpression_00.m_start = "1 == chunk.numberSpinGroups()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_00,(SourceLineInfo *)local_b0,capturedExpression_00,
             ContinueOnFailure);
  local_98[0]._8_4_ =
       (undefined4)
       ((_Head_base<3UL,_long,_false> *)
       ((long)&(chunk->super_ListRecord).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long> + 0x10))->_M_head_impl;
  local_a8._1_1_ = local_98[0]._8_4_ == 1;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc2b0;
  local_a8._4_4_ = 1;
  local_a0._M_current = (double *)0x181da4;
  local_98[0]._M_allocated_capacity = (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xce;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0x10;
  capturedExpression_01.m_start = "2 == chunk.NPP()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_01,(SourceLineInfo *)local_b0,capturedExpression_01,
             ContinueOnFailure);
  lVar4 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
  auVar1._8_8_ = lVar4 >> 0x3f;
  auVar1._0_8_ = lVar4 >> 3;
  local_98[0]._8_4_ = SUB164(auVar1 / SEXT816(0xc),0);
  local_a8._1_1_ = local_98[0]._8_4_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc2f0;
  local_a8._4_4_ = 2;
  local_a0._M_current = (double *)0x181da4;
  local_98[0]._M_allocated_capacity = (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xcf;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x20;
  capturedExpression_02.m_start = "2 == chunk.numberParticlePairs()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_02,(SourceLineInfo *)local_b0,capturedExpression_02,
             ContinueOnFailure);
  lVar4 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
  auVar2._8_8_ = lVar4 >> 0x3f;
  auVar2._0_8_ = lVar4 >> 3;
  local_98[0]._8_4_ = SUB164(auVar2 / SEXT816(0xc),0);
  local_a8._1_1_ = local_98[0]._8_4_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc2f0;
  local_a8._4_4_ = 2;
  local_a0._M_current = (double *)0x181da4;
  local_98[0]._M_allocated_capacity = (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xd0;
  macroName_03.m_size = 5;
  macroName_03.m_start = "CHECK";
  capturedExpression_03.m_size = 0x16;
  capturedExpression_03.m_start = "2 == chunk.MA().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_03,(SourceLineInfo *)local_b0,capturedExpression_03,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::MA
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  local_98[0]._8_8_ =
       (((CONCAT44(uStack_6c,CONCAT22(uStack_6e,CONCAT11(bStack_6f,local_70))) -
          (long)local_68._M_head_impl._M_current >> 3) + local_60) - 1) / local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc330;
  local_a8._4_4_ = 2;
  local_a0._M_current = (double *)0x181da4;
  local_98[0]._M_allocated_capacity = (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xd1;
  macroName_04.m_size = 5;
  macroName_04.m_start = "CHECK";
  capturedExpression_04.m_size = 0x21;
  capturedExpression_04.m_start = "2 == chunk.massParticleA().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_04,(SourceLineInfo *)local_b0,capturedExpression_04,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::MA
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  local_98[0]._8_8_ =
       (((CONCAT44(uStack_6c,CONCAT22(uStack_6e,CONCAT11(bStack_6f,local_70))) -
          (long)local_68._M_head_impl._M_current >> 3) + local_60) - 1) / local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc330;
  local_a8._4_4_ = 2;
  local_a0._M_current = (double *)0x181da4;
  local_98[0]._M_allocated_capacity = (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xd2;
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  capturedExpression_05.m_size = 0x16;
  capturedExpression_05.m_start = "2 == chunk.MB().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_05,(SourceLineInfo *)local_b0,capturedExpression_05,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::MB
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  local_98[0]._8_8_ =
       (((CONCAT44(uStack_6c,CONCAT22(uStack_6e,CONCAT11(bStack_6f,local_70))) -
          (long)local_68._M_head_impl._M_current >> 3) + local_60) - 1) / local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc330;
  local_a8._4_4_ = 2;
  local_a0._M_current = (double *)0x181da4;
  local_98[0]._M_allocated_capacity = (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xd3;
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  capturedExpression_06.m_size = 0x21;
  capturedExpression_06.m_start = "2 == chunk.massParticleB().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_06,(SourceLineInfo *)local_b0,capturedExpression_06,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::MB
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  local_98[0]._8_8_ =
       (((CONCAT44(uStack_6c,CONCAT22(uStack_6e,CONCAT11(bStack_6f,local_70))) -
          (long)local_68._M_head_impl._M_current >> 3) + local_60) - 1) / local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc330;
  local_a8._4_4_ = 2;
  local_a0._M_current = (double *)0x181da4;
  local_98[0]._M_allocated_capacity = (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xd4;
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  capturedExpression_07.m_size = 0x16;
  capturedExpression_07.m_start = "2 == chunk.ZA().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_07,(SourceLineInfo *)local_b0,capturedExpression_07,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::ZA
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  local_98[0]._8_8_ =
       (((CONCAT44(uStack_6c,CONCAT22(uStack_6e,CONCAT11(bStack_6f,local_70))) -
          (long)local_68._M_head_impl._M_current >> 3) + local_60) - 1) / local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc330;
  local_a8._4_4_ = 2;
  local_a0._M_current = (double *)0x181da4;
  local_98[0]._M_allocated_capacity = (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xd5;
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  capturedExpression_08.m_size = 0x23;
  capturedExpression_08.m_start = "2 == chunk.chargeParticleA().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_08,(SourceLineInfo *)local_b0,capturedExpression_08,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::ZA
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  local_98[0]._8_8_ =
       (((CONCAT44(uStack_6c,CONCAT22(uStack_6e,CONCAT11(bStack_6f,local_70))) -
          (long)local_68._M_head_impl._M_current >> 3) + local_60) - 1) / local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc330;
  local_a8._4_4_ = 2;
  local_a0._M_current = (double *)0x181da4;
  local_98[0]._M_allocated_capacity = (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xd6;
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  capturedExpression_09.m_size = 0x16;
  capturedExpression_09.m_start = "2 == chunk.ZB().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_09,(SourceLineInfo *)local_b0,capturedExpression_09,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::ZB
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  local_98[0]._8_8_ =
       (((CONCAT44(uStack_6c,CONCAT22(uStack_6e,CONCAT11(bStack_6f,local_70))) -
          (long)local_68._M_head_impl._M_current >> 3) + local_60) - 1) / local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc330;
  local_a8._4_4_ = 2;
  local_a0._M_current = (double *)0x181da4;
  local_98[0]._M_allocated_capacity = (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xd7;
  macroName_10.m_size = 5;
  macroName_10.m_start = "CHECK";
  capturedExpression_10.m_size = 0x23;
  capturedExpression_10.m_start = "2 == chunk.chargeParticleB().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_10,(SourceLineInfo *)local_b0,capturedExpression_10,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::ZB
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  local_98[0]._8_8_ =
       (((CONCAT44(uStack_6c,CONCAT22(uStack_6e,CONCAT11(bStack_6f,local_70))) -
          (long)local_68._M_head_impl._M_current >> 3) + local_60) - 1) / local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc330;
  local_a8._4_4_ = 2;
  local_a0._M_current = (double *)0x181da4;
  local_98[0]._M_allocated_capacity = (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xd8;
  macroName_11.m_size = 5;
  macroName_11.m_start = "CHECK";
  capturedExpression_11.m_size = 0x16;
  capturedExpression_11.m_start = "2 == chunk.IA().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_11,(SourceLineInfo *)local_b0,capturedExpression_11,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::IA
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  local_98[0]._8_8_ =
       (((CONCAT44(uStack_6c,CONCAT22(uStack_6e,CONCAT11(bStack_6f,local_70))) -
          (long)local_68._M_head_impl._M_current >> 3) + local_60) - 1) / local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc330;
  local_a8._4_4_ = 2;
  local_a0._M_current = (double *)0x181da4;
  local_98[0]._M_allocated_capacity = (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xd9;
  macroName_12.m_size = 5;
  macroName_12.m_start = "CHECK";
  capturedExpression_12.m_size = 0x21;
  capturedExpression_12.m_start = "2 == chunk.spinParticleA().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_12,(SourceLineInfo *)local_b0,capturedExpression_12,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::IA
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  local_98[0]._8_8_ =
       (((CONCAT44(uStack_6c,CONCAT22(uStack_6e,CONCAT11(bStack_6f,local_70))) -
          (long)local_68._M_head_impl._M_current >> 3) + local_60) - 1) / local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc330;
  local_a8._4_4_ = 2;
  local_a0._M_current = (double *)0x181da4;
  local_98[0]._M_allocated_capacity = (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xda;
  macroName_13.m_size = 5;
  macroName_13.m_start = "CHECK";
  capturedExpression_13.m_size = 0x16;
  capturedExpression_13.m_start = "2 == chunk.IB().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_13,(SourceLineInfo *)local_b0,capturedExpression_13,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::IB
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  local_98[0]._8_8_ =
       (((CONCAT44(uStack_6c,CONCAT22(uStack_6e,CONCAT11(bStack_6f,local_70))) -
          (long)local_68._M_head_impl._M_current >> 3) + local_60) - 1) / local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc330;
  local_a8._4_4_ = 2;
  local_a0._M_current = (double *)0x181da4;
  local_98[0]._M_allocated_capacity = (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xdb;
  macroName_14.m_size = 5;
  macroName_14.m_start = "CHECK";
  capturedExpression_14.m_size = 0x21;
  capturedExpression_14.m_start = "2 == chunk.spinParticleB().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_14,(SourceLineInfo *)local_b0,capturedExpression_14,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::IB
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  local_98[0]._8_8_ =
       (((CONCAT44(uStack_6c,CONCAT22(uStack_6e,CONCAT11(bStack_6f,local_70))) -
          (long)local_68._M_head_impl._M_current >> 3) + local_60) - 1) / local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc330;
  local_a8._4_4_ = 2;
  local_a0._M_current = (double *)0x181da4;
  local_98[0]._M_allocated_capacity = (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xdc;
  macroName_15.m_size = 5;
  macroName_15.m_start = "CHECK";
  capturedExpression_15.m_size = 0x16;
  capturedExpression_15.m_start = "2 == chunk.PA().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_15,(SourceLineInfo *)local_b0,capturedExpression_15,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::PA
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  local_98[0]._8_8_ =
       (((CONCAT44(uStack_6c,CONCAT22(uStack_6e,CONCAT11(bStack_6f,local_70))) -
          (long)local_68._M_head_impl._M_current >> 3) + local_60) - 1) / local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc330;
  local_a8._4_4_ = 2;
  local_a0._M_current = (double *)0x181da4;
  local_98[0]._M_allocated_capacity = (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xdd;
  macroName_16.m_size = 5;
  macroName_16.m_start = "CHECK";
  capturedExpression_16.m_size = 0x23;
  capturedExpression_16.m_start = "2 == chunk.parityParticleA().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_16,(SourceLineInfo *)local_b0,capturedExpression_16,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::PA
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  local_98[0]._8_8_ =
       (((CONCAT44(uStack_6c,CONCAT22(uStack_6e,CONCAT11(bStack_6f,local_70))) -
          (long)local_68._M_head_impl._M_current >> 3) + local_60) - 1) / local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc330;
  local_a8._4_4_ = 2;
  local_a0._M_current = (double *)0x181da4;
  local_98[0]._M_allocated_capacity = (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xde;
  macroName_17.m_size = 5;
  macroName_17.m_start = "CHECK";
  capturedExpression_17.m_size = 0x16;
  capturedExpression_17.m_start = "2 == chunk.PB().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_17,(SourceLineInfo *)local_b0,capturedExpression_17,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::PB
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  local_98[0]._8_8_ =
       (((CONCAT44(uStack_6c,CONCAT22(uStack_6e,CONCAT11(bStack_6f,local_70))) -
          (long)local_68._M_head_impl._M_current >> 3) + local_60) - 1) / local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc330;
  local_a8._4_4_ = 2;
  local_a0._M_current = (double *)0x181da4;
  local_98[0]._M_allocated_capacity = (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xdf;
  macroName_18.m_size = 5;
  macroName_18.m_start = "CHECK";
  capturedExpression_18.m_size = 0x23;
  capturedExpression_18.m_start = "2 == chunk.parityParticleB().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_18,(SourceLineInfo *)local_b0,capturedExpression_18,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::PB
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  local_98[0]._8_8_ =
       (((CONCAT44(uStack_6c,CONCAT22(uStack_6e,CONCAT11(bStack_6f,local_70))) -
          (long)local_68._M_head_impl._M_current >> 3) + local_60) - 1) / local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc330;
  local_a8._4_4_ = 2;
  local_a0._M_current = (double *)0x181da4;
  local_98[0]._M_allocated_capacity = (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xe0;
  macroName_19.m_size = 5;
  macroName_19.m_start = "CHECK";
  capturedExpression_19.m_size = 0x15;
  capturedExpression_19.m_start = "2 == chunk.Q().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_19,(SourceLineInfo *)local_b0,capturedExpression_19,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::Q
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  local_98[0]._8_8_ =
       (((CONCAT44(uStack_6c,CONCAT22(uStack_6e,CONCAT11(bStack_6f,local_70))) -
          (long)local_68._M_head_impl._M_current >> 3) + local_60) - 1) / local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc330;
  local_a8._4_4_ = 2;
  local_a0._M_current = (double *)0x181da4;
  local_98[0]._M_allocated_capacity = (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xe1;
  macroName_20.m_size = 5;
  macroName_20.m_start = "CHECK";
  capturedExpression_20.m_size = 0x17;
  capturedExpression_20.m_start = "2 == chunk.PNT().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_20,(SourceLineInfo *)local_b0,capturedExpression_20,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::PNT
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ParticlePairs_hpp:144:49)>
              *)local_b0,chunk);
  local_58 = ((((long)local_a0._M_current - local_98[0]._0_8_ >> 3) + local_98[0]._8_8_) - 1U) /
             (ulong)local_98[0]._8_8_;
  bStack_6f = local_58 == 2;
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc330;
  uStack_6c = 2;
  local_68._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x181da4;
  local_60 = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xe2;
  macroName_21.m_size = 5;
  macroName_21.m_start = "CHECK";
  capturedExpression_21.m_size = 0x25;
  capturedExpression_21.m_start = "2 == chunk.penetrabilityFlag().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_21,(SourceLineInfo *)local_b0,capturedExpression_21,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::PNT
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ParticlePairs_hpp:144:49)>
              *)local_b0,chunk);
  local_58 = ((((long)local_a0._M_current - local_98[0]._0_8_ >> 3) + local_98[0]._8_8_) - 1U) /
             (ulong)local_98[0]._8_8_;
  bStack_6f = local_58 == 2;
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc330;
  uStack_6c = 2;
  local_68._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x181da4;
  local_60 = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xe3;
  macroName_22.m_size = 5;
  macroName_22.m_start = "CHECK";
  capturedExpression_22.m_size = 0x17;
  capturedExpression_22.m_start = "2 == chunk.SHF().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_22,(SourceLineInfo *)local_b0,capturedExpression_22,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::SHF
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ParticlePairs_hpp:157:49)>
              *)local_b0,chunk);
  local_58 = ((((long)local_a0._M_current - local_98[0]._0_8_ >> 3) + local_98[0]._8_8_) - 1U) /
             (ulong)local_98[0]._8_8_;
  bStack_6f = local_58 == 2;
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc330;
  uStack_6c = 2;
  local_68._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x181da4;
  local_60 = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xe4;
  macroName_23.m_size = 5;
  macroName_23.m_start = "CHECK";
  capturedExpression_23.m_size = 0x23;
  capturedExpression_23.m_start = "2 == chunk.shiftFactorFlag().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_23,(SourceLineInfo *)local_b0,capturedExpression_23,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::SHF
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ParticlePairs_hpp:157:49)>
              *)local_b0,chunk);
  local_58 = ((((long)local_a0._M_current - local_98[0]._0_8_ >> 3) + local_98[0]._8_8_) - 1U) /
             (ulong)local_98[0]._8_8_;
  bStack_6f = local_58 == 2;
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc330;
  uStack_6c = 2;
  local_68._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x181da4;
  local_60 = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xe5;
  macroName_24.m_size = 5;
  macroName_24.m_start = "CHECK";
  capturedExpression_24.m_size = 0x16;
  capturedExpression_24.m_start = "2 == chunk.MT().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_24,(SourceLineInfo *)local_b0,capturedExpression_24,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::MT
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ParticlePairs_hpp:170:49)>
              *)local_b0,chunk);
  local_58 = ((((long)local_a0._M_current - local_98[0]._0_8_ >> 3) + local_98[0]._8_8_) - 1U) /
             (ulong)local_98[0]._8_8_;
  bStack_6f = local_58 == 2;
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc330;
  uStack_6c = 2;
  local_68._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x181da4;
  local_60 = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xe7;
  macroName_25.m_size = 10;
  macroName_25.m_start = "CHECK_THAT";
  capturedExpression_25.m_size = 0x1e;
  capturedExpression_25.m_start = "0., WithinRel( chunk.MA()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_25,(SourceLineInfo *)local_b0,capturedExpression_25,
             ContinueOnFailure);
  local_100 = 0.0;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::MA
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xe8;
  macroName_26.m_size = 10;
  macroName_26.m_start = "CHECK_THAT";
  capturedExpression_26.m_size = 0x1e;
  capturedExpression_26.m_start = "1., WithinRel( chunk.MA()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_26,(SourceLineInfo *)local_b0,capturedExpression_26,
             ContinueOnFailure);
  local_100 = 1.0;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::MA
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xe9;
  macroName_27.m_size = 10;
  macroName_27.m_start = "CHECK_THAT";
  capturedExpression_27.m_size = 0x28;
  capturedExpression_27.m_start = "0, WithinRel( chunk.massParticleA()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_27,(SourceLineInfo *)local_b0,capturedExpression_27,
             ContinueOnFailure);
  local_100 = (double)((ulong)local_100 & 0xffffffff00000000);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::MA
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  Catch::MatchExpr<int,_Catch::Matchers::WithinRelMatcher>::MatchExpr
            (&local_50,(int *)&local_100,(WithinRelMatcher *)local_b0);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xea;
  macroName_28.m_size = 10;
  macroName_28.m_start = "CHECK_THAT";
  capturedExpression_28.m_size = 0x28;
  capturedExpression_28.m_start = "1, WithinRel( chunk.massParticleA()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_28,(SourceLineInfo *)local_b0,capturedExpression_28,
             ContinueOnFailure);
  local_100 = (double)CONCAT44(local_100._4_4_,1);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::MA
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  Catch::MatchExpr<int,_Catch::Matchers::WithinRelMatcher>::MatchExpr
            (&local_50,(int *)&local_100,(WithinRelMatcher *)local_b0);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xeb;
  macroName_29.m_size = 10;
  macroName_29.m_start = "CHECK_THAT";
  capturedExpression_29.m_size = 0x27;
  capturedExpression_29.m_start = "5.446635e+1, WithinRel( chunk.MB()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_29,(SourceLineInfo *)local_b0,capturedExpression_29,
             ContinueOnFailure);
  local_100 = 54.46635;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::MB
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xec;
  macroName_30.m_size = 10;
  macroName_30.m_start = "CHECK_THAT";
  capturedExpression_30.m_size = 0x27;
  capturedExpression_30.m_start = "5.347624e+1, WithinRel( chunk.MB()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_30,(SourceLineInfo *)local_b0,capturedExpression_30,
             ContinueOnFailure);
  local_100 = 53.47624;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::MB
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xed;
  macroName_31.m_size = 10;
  macroName_31.m_start = "CHECK_THAT";
  capturedExpression_31.m_size = 0x32;
  capturedExpression_31.m_start = "5.446635e+1, WithinRel( chunk.massParticleB()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_31,(SourceLineInfo *)local_b0,capturedExpression_31,
             ContinueOnFailure);
  local_100 = 54.46635;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::MB
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xee;
  macroName_32.m_size = 10;
  macroName_32.m_start = "CHECK_THAT";
  capturedExpression_32.m_size = 0x32;
  capturedExpression_32.m_start = "5.347624e+1, WithinRel( chunk.massParticleB()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_32,(SourceLineInfo *)local_b0,capturedExpression_32,
             ContinueOnFailure);
  local_100 = 53.47624;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::MB
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xef;
  macroName_33.m_size = 10;
  macroName_33.m_start = "CHECK_THAT";
  capturedExpression_33.m_size = 0x1e;
  capturedExpression_33.m_start = "2., WithinRel( chunk.ZA()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_33,(SourceLineInfo *)local_b0,capturedExpression_33,
             ContinueOnFailure);
  local_100 = 2.0;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::ZA
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xf0;
  macroName_34.m_size = 10;
  macroName_34.m_start = "CHECK_THAT";
  capturedExpression_34.m_size = 0x1e;
  capturedExpression_34.m_start = "3., WithinRel( chunk.ZA()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_34,(SourceLineInfo *)local_b0,capturedExpression_34,
             ContinueOnFailure);
  local_100 = 3.0;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::ZA
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xf1;
  macroName_35.m_size = 10;
  macroName_35.m_start = "CHECK_THAT";
  capturedExpression_35.m_size = 0x2b;
  capturedExpression_35.m_start = "2., WithinRel( chunk.chargeParticleA()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_35,(SourceLineInfo *)local_b0,capturedExpression_35,
             ContinueOnFailure);
  local_100 = 2.0;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::ZA
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xf2;
  macroName_36.m_size = 10;
  macroName_36.m_start = "CHECK_THAT";
  capturedExpression_36.m_size = 0x2b;
  capturedExpression_36.m_start = "3., WithinRel( chunk.chargeParticleA()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_36,(SourceLineInfo *)local_b0,capturedExpression_36,
             ContinueOnFailure);
  local_100 = 3.0;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::ZA
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xf3;
  macroName_37.m_size = 10;
  macroName_37.m_start = "CHECK_THAT";
  capturedExpression_37.m_size = 0x1f;
  capturedExpression_37.m_start = "26., WithinRel( chunk.ZB()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_37,(SourceLineInfo *)local_b0,capturedExpression_37,
             ContinueOnFailure);
  local_100 = 26.0;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::ZB
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xf4;
  macroName_38.m_size = 10;
  macroName_38.m_start = "CHECK_THAT";
  capturedExpression_38.m_size = 0x1f;
  capturedExpression_38.m_start = "27., WithinRel( chunk.ZB()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_38,(SourceLineInfo *)local_b0,capturedExpression_38,
             ContinueOnFailure);
  local_100 = 27.0;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::ZB
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xf5;
  macroName_39.m_size = 10;
  macroName_39.m_start = "CHECK_THAT";
  capturedExpression_39.m_size = 0x2c;
  capturedExpression_39.m_start = "26., WithinRel( chunk.chargeParticleB()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_39,(SourceLineInfo *)local_b0,capturedExpression_39,
             ContinueOnFailure);
  local_100 = 26.0;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::ZB
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xf6;
  macroName_40.m_size = 10;
  macroName_40.m_start = "CHECK_THAT";
  capturedExpression_40.m_size = 0x2c;
  capturedExpression_40.m_start = "27., WithinRel( chunk.chargeParticleB()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_40,(SourceLineInfo *)local_b0,capturedExpression_40,
             ContinueOnFailure);
  local_100 = 27.0;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::ZB
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xf7;
  macroName_41.m_size = 10;
  macroName_41.m_start = "CHECK_THAT";
  capturedExpression_41.m_size = 0x1e;
  capturedExpression_41.m_start = "1., WithinRel( chunk.IA()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_41,(SourceLineInfo *)local_b0,capturedExpression_41,
             ContinueOnFailure);
  local_100 = 1.0;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::IA
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xf8;
  macroName_42.m_size = 10;
  macroName_42.m_start = "CHECK_THAT";
  capturedExpression_42.m_size = 0x1f;
  capturedExpression_42.m_start = "0.5, WithinRel( chunk.IA()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_42,(SourceLineInfo *)local_b0,capturedExpression_42,
             ContinueOnFailure);
  local_100 = 0.5;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::IA
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xf9;
  macroName_43.m_size = 10;
  macroName_43.m_start = "CHECK_THAT";
  capturedExpression_43.m_size = 0x29;
  capturedExpression_43.m_start = "1., WithinRel( chunk.spinParticleA()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_43,(SourceLineInfo *)local_b0,capturedExpression_43,
             ContinueOnFailure);
  local_100 = 1.0;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::IA
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xfa;
  macroName_44.m_size = 10;
  macroName_44.m_start = "CHECK_THAT";
  capturedExpression_44.m_size = 0x2a;
  capturedExpression_44.m_start = "0.5, WithinRel( chunk.spinParticleA()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_44,(SourceLineInfo *)local_b0,capturedExpression_44,
             ContinueOnFailure);
  local_100 = 0.5;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::IA
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xfb;
  macroName_45.m_size = 10;
  macroName_45.m_start = "CHECK_THAT";
  capturedExpression_45.m_size = 0x1e;
  capturedExpression_45.m_start = "4., WithinRel( chunk.IB()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_45,(SourceLineInfo *)local_b0,capturedExpression_45,
             ContinueOnFailure);
  local_100 = 4.0;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::IB
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xfc;
  macroName_46.m_size = 10;
  macroName_46.m_start = "CHECK_THAT";
  capturedExpression_46.m_size = 0x1e;
  capturedExpression_46.m_start = "5., WithinRel( chunk.IB()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_46,(SourceLineInfo *)local_b0,capturedExpression_46,
             ContinueOnFailure);
  local_100 = 5.0;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::IB
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xfd;
  macroName_47.m_size = 10;
  macroName_47.m_start = "CHECK_THAT";
  capturedExpression_47.m_size = 0x29;
  capturedExpression_47.m_start = "4., WithinRel( chunk.spinParticleB()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_47,(SourceLineInfo *)local_b0,capturedExpression_47,
             ContinueOnFailure);
  local_100 = 4.0;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::IB
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xfe;
  macroName_48.m_size = 10;
  macroName_48.m_start = "CHECK_THAT";
  capturedExpression_48.m_size = 0x29;
  capturedExpression_48.m_start = "5., WithinRel( chunk.spinParticleB()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_48,(SourceLineInfo *)local_b0,capturedExpression_48,
             ContinueOnFailure);
  local_100 = 5.0;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::IB
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0xff;
  macroName_49.m_size = 10;
  macroName_49.m_start = "CHECK_THAT";
  capturedExpression_49.m_size = 0x1f;
  capturedExpression_49.m_start = "12., WithinRel( chunk.PA()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_49,(SourceLineInfo *)local_b0,capturedExpression_49,
             ContinueOnFailure);
  local_100 = 12.0;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::PA
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0x100;
  macroName_50.m_size = 10;
  macroName_50.m_start = "CHECK_THAT";
  capturedExpression_50.m_size = 0x1f;
  capturedExpression_50.m_start = "13., WithinRel( chunk.PA()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_50,(SourceLineInfo *)local_b0,capturedExpression_50,
             ContinueOnFailure);
  local_100 = 13.0;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::PA
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0x101;
  macroName_51.m_size = 10;
  macroName_51.m_start = "CHECK_THAT";
  capturedExpression_51.m_size = 0x2c;
  capturedExpression_51.m_start = "12., WithinRel( chunk.parityParticleA()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_51,(SourceLineInfo *)local_b0,capturedExpression_51,
             ContinueOnFailure);
  local_100 = 12.0;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::PA
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0x102;
  macroName_52.m_size = 10;
  macroName_52.m_start = "CHECK_THAT";
  capturedExpression_52.m_size = 0x2c;
  capturedExpression_52.m_start = "13., WithinRel( chunk.parityParticleA()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_52,(SourceLineInfo *)local_b0,capturedExpression_52,
             ContinueOnFailure);
  local_100 = 13.0;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::PA
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0x103;
  macroName_53.m_size = 10;
  macroName_53.m_start = "CHECK_THAT";
  capturedExpression_53.m_size = 0x1f;
  capturedExpression_53.m_start = "14., WithinRel( chunk.PB()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_53,(SourceLineInfo *)local_b0,capturedExpression_53,
             ContinueOnFailure);
  local_100 = 14.0;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::PB
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0x104;
  macroName_54.m_size = 10;
  macroName_54.m_start = "CHECK_THAT";
  capturedExpression_54.m_size = 0x1f;
  capturedExpression_54.m_start = "15., WithinRel( chunk.PB()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_54,(SourceLineInfo *)local_b0,capturedExpression_54,
             ContinueOnFailure);
  local_100 = 15.0;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::PB
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0x105;
  macroName_55.m_size = 10;
  macroName_55.m_start = "CHECK_THAT";
  capturedExpression_55.m_size = 0x2c;
  capturedExpression_55.m_start = "14., WithinRel( chunk.parityParticleB()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_55,(SourceLineInfo *)local_b0,capturedExpression_55,
             ContinueOnFailure);
  local_100 = 14.0;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::PB
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0x106;
  macroName_56.m_size = 10;
  macroName_56.m_start = "CHECK_THAT";
  capturedExpression_56.m_size = 0x2c;
  capturedExpression_56.m_start = "15., WithinRel( chunk.parityParticleB()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_56,(SourceLineInfo *)local_b0,capturedExpression_56,
             ContinueOnFailure);
  local_100 = 15.0;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::PB
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0x107;
  macroName_57.m_size = 10;
  macroName_57.m_start = "CHECK_THAT";
  capturedExpression_57.m_size = 0x1d;
  capturedExpression_57.m_start = "6., WithinRel( chunk.Q()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_57,(SourceLineInfo *)local_b0,capturedExpression_57,
             ContinueOnFailure);
  local_100 = 6.0;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::Q
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0x108;
  macroName_58.m_size = 10;
  macroName_58.m_start = "CHECK_THAT";
  capturedExpression_58.m_size = 0x1d;
  capturedExpression_58.m_start = "7., WithinRel( chunk.Q()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_58,(SourceLineInfo *)local_b0,capturedExpression_58,
             ContinueOnFailure);
  local_100 = 7.0;
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::Q
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar5);
  local_50.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.super_ITransientExpression.m_isBinaryExpression = true;
  local_50.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001cc370;
  local_50.m_arg = (int *)&local_100;
  local_50.m_matcher = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_50.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0x109;
  macroName_59.m_size = 5;
  macroName_59.m_start = "CHECK";
  capturedExpression_59.m_size = 0x13;
  capturedExpression_59.m_start = "8 == chunk.PNT()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_59,(SourceLineInfo *)local_b0,capturedExpression_59,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::PNT
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ParticlePairs_hpp:144:49)>
              *)local_b0,chunk);
  rVar3 = ranges::
          view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ParticlePairs.hpp:144:49)>_>,_(ranges::cardinality)-1>
          ::operator[]<true,_true,_0,_0>
                    ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ParticlePairs_hpp:144:49)>_>,_(ranges::cardinality)_1>
                      *)local_b0,0);
  bStack_6f = rVar3 == 8;
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc2b0;
  uStack_6c = 8;
  local_68._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x181da4;
  local_60 = 2;
  local_58._0_4_ = rVar3;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0x10a;
  macroName_60.m_size = 5;
  macroName_60.m_start = "CHECK";
  capturedExpression_60.m_size = 0x13;
  capturedExpression_60.m_start = "9 == chunk.PNT()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_60,(SourceLineInfo *)local_b0,capturedExpression_60,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::PNT
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ParticlePairs_hpp:144:49)>
              *)local_b0,chunk);
  local_58._0_4_ =
       ranges::
       view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ParticlePairs.hpp:144:49)>_>,_(ranges::cardinality)-1>
       ::operator[]<true,_true,_0,_0>
                 ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ParticlePairs_hpp:144:49)>_>,_(ranges::cardinality)_1>
                   *)local_b0,1);
  bStack_6f = (range_reference_t<D<true>_>_conflict)local_58 == 9;
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc2b0;
  uStack_6c = 9;
  local_68._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x181da4;
  local_60 = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0x10b;
  macroName_61.m_size = 5;
  macroName_61.m_start = "CHECK";
  capturedExpression_61.m_size = 0x21;
  capturedExpression_61.m_start = "8 == chunk.penetrabilityFlag()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_61,(SourceLineInfo *)local_b0,capturedExpression_61,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::PNT
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ParticlePairs_hpp:144:49)>
              *)local_b0,chunk);
  local_58._0_4_ =
       ranges::
       view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ParticlePairs.hpp:144:49)>_>,_(ranges::cardinality)-1>
       ::operator[]<true,_true,_0,_0>
                 ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ParticlePairs_hpp:144:49)>_>,_(ranges::cardinality)_1>
                   *)local_b0,0);
  bStack_6f = (range_reference_t<D<true>_>_conflict)local_58 == 8;
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc2b0;
  uStack_6c = 8;
  local_68._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x181da4;
  local_60 = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0x10c;
  macroName_62.m_size = 5;
  macroName_62.m_start = "CHECK";
  capturedExpression_62.m_size = 0x21;
  capturedExpression_62.m_start = "9 == chunk.penetrabilityFlag()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_62,(SourceLineInfo *)local_b0,capturedExpression_62,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::PNT
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ParticlePairs_hpp:144:49)>
              *)local_b0,chunk);
  local_58._0_4_ =
       ranges::
       view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ParticlePairs.hpp:144:49)>_>,_(ranges::cardinality)-1>
       ::operator[]<true,_true,_0,_0>
                 ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ParticlePairs_hpp:144:49)>_>,_(ranges::cardinality)_1>
                   *)local_b0,1);
  bStack_6f = (range_reference_t<D<true>_>_conflict)local_58 == 9;
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc2b0;
  uStack_6c = 9;
  local_68._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x181da4;
  local_60 = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0x10d;
  macroName_63.m_size = 5;
  macroName_63.m_start = "CHECK";
  capturedExpression_63.m_size = 0x14;
  capturedExpression_63.m_start = "10 == chunk.SHF()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_63,(SourceLineInfo *)local_b0,capturedExpression_63,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::SHF
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ParticlePairs_hpp:157:49)>
              *)local_b0,chunk);
  local_58._0_4_ =
       ranges::
       view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ParticlePairs.hpp:157:49)>_>,_(ranges::cardinality)-1>
       ::operator[]<true,_true,_0,_0>
                 ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ParticlePairs_hpp:157:49)>_>,_(ranges::cardinality)_1>
                   *)local_b0,0);
  bStack_6f = (range_reference_t<D<true>_>_conflict)local_58 == 10;
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc2b0;
  uStack_6c = 10;
  local_68._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x181da4;
  local_60 = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0x10e;
  macroName_64.m_size = 5;
  macroName_64.m_start = "CHECK";
  capturedExpression_64.m_size = 0x14;
  capturedExpression_64.m_start = "11 == chunk.SHF()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_64,(SourceLineInfo *)local_b0,capturedExpression_64,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::SHF
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ParticlePairs_hpp:157:49)>
              *)local_b0,chunk);
  local_58._0_4_ =
       ranges::
       view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ParticlePairs.hpp:157:49)>_>,_(ranges::cardinality)-1>
       ::operator[]<true,_true,_0,_0>
                 ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ParticlePairs_hpp:157:49)>_>,_(ranges::cardinality)_1>
                   *)local_b0,1);
  bStack_6f = (range_reference_t<D<true>_>_conflict)local_58 == 0xb;
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc2b0;
  uStack_6c = 0xb;
  local_68._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x181da4;
  local_60 = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0x10f;
  macroName_65.m_size = 5;
  macroName_65.m_start = "CHECK";
  capturedExpression_65.m_size = 0x20;
  capturedExpression_65.m_start = "10 == chunk.shiftFactorFlag()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_65,(SourceLineInfo *)local_b0,capturedExpression_65,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::SHF
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ParticlePairs_hpp:157:49)>
              *)local_b0,chunk);
  local_58._0_4_ =
       ranges::
       view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ParticlePairs.hpp:157:49)>_>,_(ranges::cardinality)-1>
       ::operator[]<true,_true,_0,_0>
                 ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ParticlePairs_hpp:157:49)>_>,_(ranges::cardinality)_1>
                   *)local_b0,0);
  bStack_6f = (range_reference_t<D<true>_>_conflict)local_58 == 10;
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc2b0;
  uStack_6c = 10;
  local_68._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x181da4;
  local_60 = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0x110;
  macroName_66.m_size = 5;
  macroName_66.m_start = "CHECK";
  capturedExpression_66.m_size = 0x20;
  capturedExpression_66.m_start = "11 == chunk.shiftFactorFlag()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_66,(SourceLineInfo *)local_b0,capturedExpression_66,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::SHF
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ParticlePairs_hpp:157:49)>
              *)local_b0,chunk);
  local_58._0_4_ =
       ranges::
       view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ParticlePairs.hpp:157:49)>_>,_(ranges::cardinality)-1>
       ::operator[]<true,_true,_0,_0>
                 ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ParticlePairs_hpp:157:49)>_>,_(ranges::cardinality)_1>
                   *)local_b0,1);
  bStack_6f = (range_reference_t<D<true>_>_conflict)local_58 == 0xb;
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc2b0;
  uStack_6c = 0xb;
  local_68._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x181da4;
  local_60 = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0x111;
  macroName_67.m_size = 5;
  macroName_67.m_start = "CHECK";
  capturedExpression_67.m_size = 0x14;
  capturedExpression_67.m_start = "102 == chunk.MT()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_67,(SourceLineInfo *)local_b0,capturedExpression_67,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::MT
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ParticlePairs_hpp:170:49)>
              *)local_b0,chunk);
  local_58._0_4_ =
       ranges::
       view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ParticlePairs.hpp:170:49)>_>,_(ranges::cardinality)-1>
       ::operator[]<true,_true,_0,_0>
                 ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ParticlePairs_hpp:170:49)>_>,_(ranges::cardinality)_1>
                   *)local_b0,0);
  bStack_6f = (range_reference_t<D<true>_>_conflict)local_58 == 0x66;
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc2b0;
  uStack_6c = 0x66;
  local_68._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x181da4;
  local_60 = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0x112;
  macroName_68.m_size = 5;
  macroName_68.m_start = "CHECK";
  capturedExpression_68.m_size = 0x12;
  capturedExpression_68.m_start = "2 == chunk.MT()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_68,(SourceLineInfo *)local_b0,capturedExpression_68,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::MT
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ParticlePairs_hpp:170:49)>
              *)local_b0,chunk);
  rVar3 = ranges::
          view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ParticlePairs.hpp:170:49)>_>,_(ranges::cardinality)-1>
          ::operator[]<true,_true,_0,_0>
                    ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ParticlePairs_hpp:170:49)>_>,_(ranges::cardinality)_1>
                      *)local_b0,1);
  bStack_6f = rVar3 == 2;
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc2b0;
  uStack_6c = 2;
  local_68._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x181da4;
  local_60 = 2;
  local_58 = CONCAT44(local_58._4_4_,rVar3);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x1804e4;
  local_a8 = (pointer)0x114;
  macroName_69.m_size = 5;
  macroName_69.m_start = "CHECK";
  capturedExpression_69.m_size = 0xf;
  capturedExpression_69.m_start = "5 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_69,(SourceLineInfo *)local_b0,capturedExpression_69,
             ContinueOnFailure);
  local_98[0]._8_8_ =
       (((long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3) + 5) / 6 + 1;
  local_a8._1_1_ = local_98[0]._8_8_ == 5;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cc3f0;
  local_a8._4_4_ = 5;
  local_a0._M_current = (double *)0x181da4;
  local_98[0]._M_allocated_capacity = (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void verifyChunk( const ParticlePairs& chunk ) {

  CHECK( 1 == chunk.NJSX() );
  CHECK( 1 == chunk.numberSpinGroups() );

  CHECK( 2 == chunk.NPP() );
  CHECK( 2 == chunk.numberParticlePairs() );
  CHECK( 2 == chunk.MA().size() );
  CHECK( 2 == chunk.massParticleA().size() );
  CHECK( 2 == chunk.MB().size() );
  CHECK( 2 == chunk.massParticleB().size() );
  CHECK( 2 == chunk.ZA().size() );
  CHECK( 2 == chunk.chargeParticleA().size() );
  CHECK( 2 == chunk.ZB().size() );
  CHECK( 2 == chunk.chargeParticleB().size() );
  CHECK( 2 == chunk.IA().size() );
  CHECK( 2 == chunk.spinParticleA().size() );
  CHECK( 2 == chunk.IB().size() );
  CHECK( 2 == chunk.spinParticleB().size() );
  CHECK( 2 == chunk.PA().size() );
  CHECK( 2 == chunk.parityParticleA().size() );
  CHECK( 2 == chunk.PB().size() );
  CHECK( 2 == chunk.parityParticleB().size() );
  CHECK( 2 == chunk.Q().size() );
  CHECK( 2 == chunk.PNT().size() );
  CHECK( 2 == chunk.penetrabilityFlag().size() );
  CHECK( 2 == chunk.SHF().size() );
  CHECK( 2 == chunk.shiftFactorFlag().size() );
  CHECK( 2 == chunk.MT().size() );

  CHECK_THAT( 0., WithinRel( chunk.MA()[0] ) );
  CHECK_THAT( 1., WithinRel( chunk.MA()[1] ) );
  CHECK_THAT( 0, WithinRel( chunk.massParticleA()[0] ) );
  CHECK_THAT( 1, WithinRel( chunk.massParticleA()[1] ) );
  CHECK_THAT( 5.446635e+1, WithinRel( chunk.MB()[0] ) );
  CHECK_THAT( 5.347624e+1, WithinRel( chunk.MB()[1] ) );
  CHECK_THAT( 5.446635e+1, WithinRel( chunk.massParticleB()[0] ) );
  CHECK_THAT( 5.347624e+1, WithinRel( chunk.massParticleB()[1] ) );
  CHECK_THAT( 2., WithinRel( chunk.ZA()[0] ) );
  CHECK_THAT( 3., WithinRel( chunk.ZA()[1] ) );
  CHECK_THAT( 2., WithinRel( chunk.chargeParticleA()[0] ) );
  CHECK_THAT( 3., WithinRel( chunk.chargeParticleA()[1] ) );
  CHECK_THAT( 26., WithinRel( chunk.ZB()[0] ) );
  CHECK_THAT( 27., WithinRel( chunk.ZB()[1] ) );
  CHECK_THAT( 26., WithinRel( chunk.chargeParticleB()[0] ) );
  CHECK_THAT( 27., WithinRel( chunk.chargeParticleB()[1] ) );
  CHECK_THAT( 1., WithinRel( chunk.IA()[0] ) );
  CHECK_THAT( 0.5, WithinRel( chunk.IA()[1] ) );
  CHECK_THAT( 1., WithinRel( chunk.spinParticleA()[0] ) );
  CHECK_THAT( 0.5, WithinRel( chunk.spinParticleA()[1] ) );
  CHECK_THAT( 4., WithinRel( chunk.IB()[0] ) );
  CHECK_THAT( 5., WithinRel( chunk.IB()[1] ) );
  CHECK_THAT( 4., WithinRel( chunk.spinParticleB()[0] ) );
  CHECK_THAT( 5., WithinRel( chunk.spinParticleB()[1] ) );
  CHECK_THAT( 12., WithinRel( chunk.PA()[0] ) );
  CHECK_THAT( 13., WithinRel( chunk.PA()[1] ) );
  CHECK_THAT( 12., WithinRel( chunk.parityParticleA()[0] ) );
  CHECK_THAT( 13., WithinRel( chunk.parityParticleA()[1] ) );
  CHECK_THAT( 14., WithinRel( chunk.PB()[0] ) );
  CHECK_THAT( 15., WithinRel( chunk.PB()[1] ) );
  CHECK_THAT( 14., WithinRel( chunk.parityParticleB()[0] ) );
  CHECK_THAT( 15., WithinRel( chunk.parityParticleB()[1] ) );
  CHECK_THAT( 6., WithinRel( chunk.Q()[0] ) );
  CHECK_THAT( 7., WithinRel( chunk.Q()[1] ) );
  CHECK( 8 == chunk.PNT()[0] );
  CHECK( 9 == chunk.PNT()[1] );
  CHECK( 8 == chunk.penetrabilityFlag()[0] );
  CHECK( 9 == chunk.penetrabilityFlag()[1] );
  CHECK( 10 == chunk.SHF()[0] );
  CHECK( 11 == chunk.SHF()[1] );
  CHECK( 10 == chunk.shiftFactorFlag()[0] );
  CHECK( 11 == chunk.shiftFactorFlag()[1] );
  CHECK( 102 == chunk.MT()[0] );
  CHECK( 2 == chunk.MT()[1] );

  CHECK( 5 == chunk.NC() );
}